

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fitscore.c
# Opt level: O0

int ffiblk(fitsfile *fptr,long nblock,int headdata,int *status)

{
  long lVar1;
  char *buffer;
  char *pcVar2;
  int iVar3;
  char local_1758 [8];
  char card [81];
  char *tmpbuff;
  char *outbuff;
  char *inbuff;
  char buff2 [2880];
  char buff1 [2880];
  char charfill;
  long nshift;
  long ii;
  LONGLONG jpoint;
  LONGLONG insertpt;
  int local_38;
  int typhdu;
  int savehdu;
  int tstatus;
  int *status_local;
  long lStack_20;
  int headdata_local;
  long nblock_local;
  fitsfile *fptr_local;
  
  if ((*status < 1) && (0 < nblock)) {
    typhdu = *status;
    if ((headdata == 0) || (fptr->Fptr->hdutype == 1)) {
      buff1[0xb3f] = ' ';
    }
    else {
      buff1[0xb3f] = '\0';
    }
    _savehdu = status;
    status_local._4_4_ = headdata;
    lStack_20 = nblock;
    nblock_local = (long)fptr;
    if (headdata == 0) {
      jpoint = fptr->Fptr->datastart;
    }
    else if (headdata == -1) {
      jpoint = 0;
      strcpy(local_1758,"XTENSION= \'IMAGE   \'          / IMAGE extension");
    }
    else {
      jpoint = ((fptr->Fptr->datastart + fptr->Fptr->heapstart + fptr->Fptr->heapsize + 0xb3f) /
               0xb40) * 0xb40;
    }
    outbuff = buff2 + 0xb38;
    tmpbuff = (char *)&inbuff;
    memset(tmpbuff,(uint)(byte)buff1[0xb3f],0xb40);
    if (lStack_20 == 1) {
      if (status_local._4_4_ == -1) {
        ffmrec((fitsfile *)nblock_local,1,local_1758,_savehdu);
      }
      ffmbyt((fitsfile *)nblock_local,jpoint,0,_savehdu);
      ffgbyt((fitsfile *)nblock_local,0xb40,outbuff,_savehdu);
      while (pcVar2 = outbuff, buffer = tmpbuff, *_savehdu < 1) {
        ffmbyt((fitsfile *)nblock_local,jpoint,0,_savehdu);
        ffpbyt((fitsfile *)nblock_local,0xb40,tmpbuff,_savehdu);
        if (0 < *_savehdu) {
          return *_savehdu;
        }
        stack0xffffffffffffe900 = outbuff;
        outbuff = tmpbuff;
        tmpbuff = pcVar2;
        jpoint = jpoint + 0xb40;
        ffmbyt((fitsfile *)nblock_local,jpoint,0,_savehdu);
        ffgbyt((fitsfile *)nblock_local,0xb40,buffer,_savehdu);
      }
      *_savehdu = typhdu;
      ffmbyt((fitsfile *)nblock_local,jpoint,1,_savehdu);
      ffpbyt((fitsfile *)nblock_local,0xb40,tmpbuff,_savehdu);
    }
    else {
      local_38 = *(int *)(*(long *)(nblock_local + 8) + 0x54);
      typhdu = *_savehdu;
      while (*_savehdu < 1) {
        ffmrhd((fitsfile *)nblock_local,1,(int *)((long)&insertpt + 4),_savehdu);
      }
      if (*_savehdu == 0x6b) {
        *_savehdu = typhdu;
      }
      ffmahd((fitsfile *)nblock_local,local_38 + 1,(int *)((long)&insertpt + 4),_savehdu);
      if (status_local._4_4_ == -1) {
        ffmrec((fitsfile *)nblock_local,1,local_1758,_savehdu);
      }
      lVar1 = *(long *)(*(long *)(*(long *)(nblock_local + 8) + 0x68) +
                       (long)(*(int *)(*(long *)(nblock_local + 8) + 0x60) + 1) * 8);
      ii = *(long *)(*(long *)(*(long *)(nblock_local + 8) + 0x68) +
                    (long)(*(int *)(*(long *)(nblock_local + 8) + 0x60) + 1) * 8);
      for (nshift = 0; ii = ii + -0xb40, nshift < (lVar1 - jpoint) / 0xb40; nshift = nshift + 1) {
        iVar3 = ffmbyt((fitsfile *)nblock_local,ii,0,_savehdu);
        if (0 < iVar3) {
          return *_savehdu;
        }
        ffgbyt((fitsfile *)nblock_local,0xb40,outbuff,_savehdu);
        ffmbyt((fitsfile *)nblock_local,ii + lStack_20 * 0xb40,1,_savehdu);
        ffpbyt((fitsfile *)nblock_local,0xb40,outbuff,_savehdu);
      }
      ffmbyt((fitsfile *)nblock_local,jpoint,1,_savehdu);
      for (nshift = 0; nshift < lStack_20; nshift = nshift + 1) {
        ffpbyt((fitsfile *)nblock_local,0xb40,tmpbuff,_savehdu);
      }
    }
    if (status_local._4_4_ == 0) {
      *(long *)(*(long *)(nblock_local + 8) + 0x88) =
           lStack_20 * 0xb40 + *(long *)(*(long *)(nblock_local + 8) + 0x88);
    }
    for (nshift = (long)*(int *)(*(long *)(nblock_local + 8) + 0x54);
        nshift <= *(int *)(*(long *)(nblock_local + 8) + 0x60); nshift = nshift + 1) {
      lVar1 = *(long *)(*(long *)(nblock_local + 8) + 0x68);
      *(long *)(lVar1 + 8 + nshift * 8) = lStack_20 * 0xb40 + *(long *)(lVar1 + 8 + nshift * 8);
    }
    fptr_local._4_4_ = *_savehdu;
  }
  else {
    fptr_local._4_4_ = *status;
  }
  return fptr_local._4_4_;
}

Assistant:

int ffiblk(fitsfile *fptr,      /* I - FITS file pointer               */
           long nblock,         /* I - no. of blocks to insert         */ 
           int headdata,        /* I - insert where? 0=header, 1=data  */
                                /*     -1=beginning of file            */
           int *status)         /* IO - error status                   */
/*
   insert 2880-byte blocks at the end of the current header or data unit
*/
{
    int tstatus, savehdu, typhdu;
    LONGLONG insertpt, jpoint;
    long ii, nshift;
    char charfill;
    char buff1[2880], buff2[2880];
    char *inbuff, *outbuff, *tmpbuff;
    char card[FLEN_CARD];

    if (*status > 0 || nblock <= 0)
        return(*status);
        
    tstatus = *status;

    if (headdata == 0 || (fptr->Fptr)->hdutype == ASCII_TBL)
        charfill = 32;  /* headers and ASCII tables have space (32) fill */
    else
        charfill = 0;   /* images and binary tables have zero fill */

    if (headdata == 0)  
        insertpt = (fptr->Fptr)->datastart;  /* insert just before data, or */
    else if (headdata == -1)
    {
        insertpt = 0;
        strcpy(card, "XTENSION= 'IMAGE   '          / IMAGE extension");
    }
    else                                     /* at end of data, */
    {
        insertpt = (fptr->Fptr)->datastart + 
                   (fptr->Fptr)->heapstart + 
                   (fptr->Fptr)->heapsize;
        insertpt = ((insertpt + 2879) / 2880) * 2880; /* start of block */

       /* the following formula is wrong because the current data unit
          may have been extended without updating the headstart value
          of the following HDU.
       */
       /* insertpt = (fptr->Fptr)->headstart[(fptr->Fptr)->curhdu + 1]; */
    }

    inbuff  = buff1;   /* set pointers to input and output buffers */
    outbuff = buff2;

    memset(outbuff, charfill, 2880); /* initialize buffer with fill */

    if (nblock == 1)  /* insert one block */
    {
      if (headdata == -1)
        ffmrec(fptr, 1, card, status);    /* change SIMPLE -> XTENSION */

      ffmbyt(fptr, insertpt, REPORT_EOF, status);  /* move to 1st point */
      ffgbyt(fptr, 2880, inbuff, status);  /* read first block of bytes */

      while (*status <= 0)
      {
        ffmbyt(fptr, insertpt, REPORT_EOF, status);  /* insert point */
        ffpbyt(fptr, 2880, outbuff, status);  /* write the output buffer */

        if (*status > 0)
            return(*status);

        tmpbuff = inbuff;   /* swap input and output pointers */
        inbuff = outbuff;
        outbuff = tmpbuff;
        insertpt += 2880;  /* increment insert point by 1 block */

        ffmbyt(fptr, insertpt, REPORT_EOF, status);  /* move to next block */
        ffgbyt(fptr, 2880, inbuff, status);  /* read block of bytes */
      }

      *status = tstatus;  /* reset status value */
      ffmbyt(fptr, insertpt, IGNORE_EOF, status); /* move back to insert pt */
      ffpbyt(fptr, 2880, outbuff, status);  /* write the final block */
    }

    else   /*  inserting more than 1 block */

    {
        savehdu = (fptr->Fptr)->curhdu;  /* save the current HDU number */
        tstatus = *status;
        while(*status <= 0)  /* find the last HDU in file */
              ffmrhd(fptr, 1, &typhdu, status);

        if (*status == END_OF_FILE)
        {
            *status = tstatus;
        }

        ffmahd(fptr, savehdu + 1, &typhdu, status);  /* move back to CHDU */
        if (headdata == -1)
          ffmrec(fptr, 1, card, status); /* NOW change SIMPLE -> XTENSION */

        /* number of 2880-byte blocks that have to be shifted down */
        nshift = (long) (((fptr->Fptr)->headstart[(fptr->Fptr)->maxhdu + 1] - insertpt)
                 / 2880);
        /* position of last block in file to be shifted */
        jpoint =  (fptr->Fptr)->headstart[(fptr->Fptr)->maxhdu + 1] - 2880;

        /* move all the blocks starting at end of file working backwards */
        for (ii = 0; ii < nshift; ii++)
        {
            /* move to the read start position */
            if (ffmbyt(fptr, jpoint, REPORT_EOF, status) > 0)
                return(*status);

            ffgbyt(fptr, 2880, inbuff,status);  /* read one record */

            /* move forward to the write postion */
            ffmbyt(fptr, jpoint + ((LONGLONG) nblock * 2880), IGNORE_EOF, status);

            ffpbyt(fptr, 2880, inbuff, status);  /* write the record */

            jpoint -= 2880;
        }

        /* move back to the write start postion (might be EOF) */
        ffmbyt(fptr, insertpt, IGNORE_EOF, status);

        for (ii = 0; ii < nblock; ii++)   /* insert correct fill value */
             ffpbyt(fptr, 2880, outbuff, status);
    }

    if (headdata == 0)         /* update data start address */
      (fptr->Fptr)->datastart += ((LONGLONG) nblock * 2880);

    /* update following HDU addresses */
    for (ii = (fptr->Fptr)->curhdu; ii <= (fptr->Fptr)->maxhdu; ii++)
         (fptr->Fptr)->headstart[ii + 1] += ((LONGLONG) nblock * 2880);

    return(*status);
}